

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O3

AMQP_VALUE amqpvalue_create_rejected(REJECTED_HANDLE rejected)

{
  AMQP_VALUE pAVar1;
  
  if (rejected != (REJECTED_HANDLE)0x0) {
    pAVar1 = amqpvalue_clone(rejected->composite_value);
    return pAVar1;
  }
  return (AMQP_VALUE)0x0;
}

Assistant:

AMQP_VALUE amqpvalue_create_rejected(REJECTED_HANDLE rejected)
{
    AMQP_VALUE result;

    if (rejected == NULL)
    {
        result = NULL;
    }
    else
    {
        REJECTED_INSTANCE* rejected_instance = (REJECTED_INSTANCE*)rejected;
        result = amqpvalue_clone(rejected_instance->composite_value);
    }

    return result;
}